

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBody.h
# Opt level: O3

void __thiscall chrono::ChLoadBodyForce::~ChLoadBodyForce(ChLoadBodyForce *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_ChLoadCustom).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadBodyForce_00b20f78;
  this_00 = (this->m_modulation).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  ChLoadCustom::~ChLoadCustom(&this->super_ChLoadCustom);
  operator_delete(this,0xb0);
  return;
}

Assistant:

class ChApi ChLoadBodyForce : public ChLoadCustom {
  public:
    ChLoadBodyForce(std::shared_ptr<ChBody> body,  ///< object to apply load to
                    const ChVector<>& force,       ///< force to apply
                    bool local_force,              ///< force is in body local coords
                    const ChVector<>& point,       ///< application point for the force
                    bool local_point = true        ///< application point is in body local coords
    );

    /// "Virtual" copy constructor (covariant return type).
    virtual ChLoadBodyForce* Clone() const override { return new ChLoadBodyForce(*this); }

    /// Set the constant force vector.
    /// It can be expressed in absolute coordinates or body local coordinates.
    /// This value is optionally modulated by a function of time.
    void SetForce(const ChVector<>& force, bool is_local);

    /// Return the current force vector (scaled by the current modulation value).
    ChVector<> GetForce() const;

    /// Set the application point of force, assumed to be constant.
    /// It can be expressed in absolute coordinates or body local coordinates
    void SetApplicationPoint(const ChVector<>& point, const bool is_local);

    /// Return the location of the application point.
    ChVector<> GetApplicationPoint() const { return m_point; }

    /// Set modulation function.
    /// This is a function of time which (optionally) modulates the specified applied force.
    /// By default the modulation is a constant function, always returning a value of 1.
    void SetModulationFunction(std::shared_ptr<ChFunction> modulation) { m_modulation = modulation; }

    /// Compute Q, the generalized load.
    /// Called automatically at each Update().
    virtual void ComputeQ(ChState* state_x,      ///< state position to evaluate Q
                          ChStateDelta* state_w  ///< state speed to evaluate Q
                          ) override;

  private:
    ChVector<> m_force;  ///< base force value
    ChVector<> m_point;  ///< application point
    bool m_local_force;  ///< is force expressed in local frame?
    bool m_local_point;  ///< is application expressed in local frame?

    std::shared_ptr<ChFunction> m_modulation;  ///< modulation function of time
    double m_scale;                            ///< scaling factor (current modulation value)

    virtual bool IsStiff() override { return false; }

    virtual void Update(double time) override;
}